

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SeesPdu.cpp
# Opt level: O2

int __thiscall DIS::SeesPdu::getMarshalledSize(SeesPdu *this)

{
  pointer pPVar1;
  pointer pVVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  PropulsionSystemData listElement;
  
  iVar3 = DistributedEmissionsFamilyPdu::getMarshalledSize
                    (&this->super_DistributedEmissionsFamilyPdu);
  iVar4 = EntityID::getMarshalledSize(&this->_orginatingEntityID);
  iVar3 = iVar3 + iVar4 + 10;
  lVar6 = 8;
  for (uVar5 = 0;
      pPVar1 = (this->_propulsionSystemData).
               super__Vector_base<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(this->_propulsionSystemData).
                            super__Vector_base<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1 >> 4);
      uVar5 = uVar5 + 1) {
    listElement._vptr_PropulsionSystemData = (_func_int **)&PTR__PropulsionSystemData_001b1bb0;
    listElement._8_8_ = *(undefined8 *)((long)&pPVar1->_vptr_PropulsionSystemData + lVar6);
    iVar4 = PropulsionSystemData::getMarshalledSize(&listElement);
    iVar3 = iVar3 + iVar4;
    PropulsionSystemData::~PropulsionSystemData(&listElement);
    lVar6 = lVar6 + 0x10;
  }
  lVar6 = 8;
  for (uVar5 = 0;
      pVVar2 = (this->_vectoringSystemData).
               super__Vector_base<DIS::VectoringNozzleSystemData,_std::allocator<DIS::VectoringNozzleSystemData>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(this->_vectoringSystemData).
                            super__Vector_base<DIS::VectoringNozzleSystemData,_std::allocator<DIS::VectoringNozzleSystemData>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2 >> 4);
      uVar5 = uVar5 + 1) {
    listElement._vptr_PropulsionSystemData = (_func_int **)&PTR__VectoringNozzleSystemData_001b2808;
    listElement._8_8_ = *(undefined8 *)((long)&pVVar2->_vptr_VectoringNozzleSystemData + lVar6);
    iVar4 = VectoringNozzleSystemData::getMarshalledSize((VectoringNozzleSystemData *)&listElement);
    iVar3 = iVar3 + iVar4;
    VectoringNozzleSystemData::~VectoringNozzleSystemData((VectoringNozzleSystemData *)&listElement)
    ;
    lVar6 = lVar6 + 0x10;
  }
  return iVar3;
}

Assistant:

int SeesPdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = DistributedEmissionsFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + _orginatingEntityID.getMarshalledSize();  // _orginatingEntityID
   marshalSize = marshalSize + 2;  // _infraredSignatureRepresentationIndex
   marshalSize = marshalSize + 2;  // _acousticSignatureRepresentationIndex
   marshalSize = marshalSize + 2;  // _radarCrossSectionSignatureRepresentationIndex
   marshalSize = marshalSize + 2;  // _numberOfPropulsionSystems
   marshalSize = marshalSize + 2;  // _numberOfVectoringNozzleSystems

   for(unsigned long long idx=0; idx < _propulsionSystemData.size(); idx++)
   {
        PropulsionSystemData listElement = _propulsionSystemData[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }


   for(unsigned long long idx=0; idx < _vectoringSystemData.size(); idx++)
   {
        VectoringNozzleSystemData listElement = _vectoringSystemData[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}